

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* deqp::gles31::Functional::anon_unknown_1::
  join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
            (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             *__return_storage_ptr__,
            vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
            *a,vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *b)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
  local_70;
  const_iterator local_68;
  MessageFilter *local_60;
  MessageFilter *local_58;
  __normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
  local_50;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
  local_48;
  const_iterator local_40;
  undefined1 local_21;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *local_20;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *b_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *a_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *retval;
  
  local_21 = 0;
  local_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  ::vector(__return_storage_ptr__);
  sVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::size(b_local);
  sVar2 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::size(local_20);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  ::reserve(__return_storage_ptr__,sVar1 + sVar2);
  local_48._M_current =
       (MessageFilter *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
       ::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>
  ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter*>
            ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>
              *)&local_40,&local_48);
  local_50._M_current =
       (MessageFilter *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
       ::begin(b_local);
  local_58 = (MessageFilter *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             ::end(b_local);
  local_60 = (MessageFilter *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
             ::
             insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>,void>
                       ((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
                         *)__return_storage_ptr__,local_40,local_50,
                        (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
                         )local_58);
  local_70._M_current =
       (MessageFilter *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
       ::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>
  ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter*>
            ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>
              *)&local_68,&local_70);
  __first = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
            ::begin(local_20);
  __last = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           ::end(local_20);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>>
              *)__return_storage_ptr__,local_68,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
              )__first._M_current,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>_>
              )__last._M_current);
  return __return_storage_ptr__;
}

Assistant:

vector<T> join(const vector<T>& a, const vector<T>&b)
{
	vector<T> retval;

	retval.reserve(a.size()+b.size());
	retval.insert(retval.end(), a.begin(), a.end());
	retval.insert(retval.end(), b.begin(), b.end());
	return retval;
}